

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

double prvTidygetArgValueDouble(TidyMessageImpl message,TidyMessageArgument *arg)

{
  int iVar1;
  int argNum;
  TidyMessageArgument *arg_local;
  
  iVar1 = (int)*arg + -1;
  if (message.argcount < iVar1) {
    __assert_fail("argNum <= message.argcount",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/messageobj.c"
                  ,0x1e9,"double prvTidygetArgValueDouble(TidyMessageImpl, TidyMessageArgument *)");
  }
  if (message.arguments[iVar1].type == tidyFormatType_DOUBLE) {
    return message.arguments[iVar1].u.d;
  }
  __assert_fail("message.arguments[argNum].type == tidyFormatType_DOUBLE",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/messageobj.c"
                ,0x1ea,"double prvTidygetArgValueDouble(TidyMessageImpl, TidyMessageArgument *)");
}

Assistant:

double TY_(getArgValueDouble)( TidyMessageImpl message, TidyMessageArgument* arg )
{
    int argNum = (int)(size_t)*arg - 1;
    assert( argNum <= message.argcount );
    assert( message.arguments[argNum].type == tidyFormatType_DOUBLE);
    
    return message.arguments[argNum].u.d;
}